

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

uint32_t * __thiscall
vsencoding::VSEncodingBlocks::decodeArray
          (VSEncodingBlocks *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  NotEnoughStorage *this_00;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t *out_00;
  uint *in_00;
  
  uVar2 = *nvalue;
  uVar5 = *in;
  uVar6 = (ulong)uVar5;
  if (uVar6 <= uVar2) {
    *nvalue = uVar6;
    in_00 = in + 1;
    uVar4 = (ulong)this->VSENCODING_BLOCKSZ;
    out_00 = out;
    if (this->VSENCODING_BLOCKSZ < uVar5) {
      do {
        uVar5 = *in_00;
        decodeVS(this,(uint32_t)uVar4,in_00 + 1,out_00,
                 (this->__tmp).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start);
        uVar1 = this->VSENCODING_BLOCKSZ;
        uVar4 = (ulong)uVar1;
        in_00 = in_00 + (ulong)uVar5 + 1;
        out_00 = out_00 + uVar4;
        uVar5 = (int)uVar6 - uVar1;
        uVar6 = (ulong)uVar5;
      } while (uVar1 < uVar5);
    }
    puVar3 = decodeVS(this,uVar5,in_00,out_00,
                      (this->__tmp).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if (out + uVar2 < out_00) {
      decodeArray();
    }
    return puVar3;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  FastPForLib::NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
  __cxa_throw(this_00,&FastPForLib::NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const uint32_t *VSEncodingBlocks::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                              const size_t len, uint32_t *out,
                                              size_t &nvalue) {
#else
                                              const size_t, uint32_t *out,
                                              size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);
  const size_t orignvalue = nvalue;
  if ((*in) > orignvalue)
    throw NotEnoughStorage(*in);
  nvalue = *(in++);
  uint32_t res;
  uint32_t sum;

  // __validate(in, (len << 2));
  //__validate(out, ((nvalue + TAIL_MERGIN) << 2));

  for (res = static_cast<uint32_t>(nvalue); res > VSENCODING_BLOCKSZ;
       out += VSENCODING_BLOCKSZ, in += sum, res -= VSENCODING_BLOCKSZ) {
    sum = *in++;
    decodeVS(VSENCODING_BLOCKSZ, in, out, &__tmp[0]);
  }

  const uint32_t *ans = decodeVS(res, in, out, &__tmp[0]);
  assert(initin + len >= in);
  if (initout + orignvalue < out)
    fprintf(stderr, "possible overrun\n");
  return ans;
}